

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<SVRG::svrg,_example> *
LEARNER::init_learner<SVRG::svrg,example,LEARNER::learner<char,example>>
          (free_ptr<SVRG::svrg> *dat,
          _func_void_svrg_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_svrg_ptr_learner<char,_example>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  learner<SVRG::svrg,_example> *plVar1;
  
  plVar1 = learner<SVRG::svrg,example>::init_learner<LEARNER::learner<char,example>>
                     ((dat->_M_t).super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl,
                      (learner<char,_example> *)0x0,learn,predict,params_per_weight,scalar);
  (dat->_M_t).super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Head_base<0UL,_SVRG::svrg_*,_false>.
  _M_head_impl = (svrg *)0x0;
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}